

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O1

size_t __thiscall flow::ConstantPool::makeIPAddress(ConstantPool *this,IPAddress *value)

{
  pointer *ppIVar1;
  Family FVar2;
  int iVar3;
  size_t __n;
  IPAddress *pIVar4;
  iterator __position;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  byte bVar8;
  
  bVar8 = 0;
  pIVar4 = (this->ipaddrs_).
           super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->ipaddrs_).
       super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar6 = (long)__position._M_current - (long)pIVar4;
  if (lVar6 != 0) {
    if (pIVar4 == value) {
      bVar7 = false;
      sVar5 = 0;
    }
    else {
      FVar2 = value->family_;
      sVar5 = 0;
      bVar7 = false;
      do {
        if (pIVar4->family_ == FVar2) {
          __n = 4;
          if (pIVar4->family_ != V4) {
            __n = 0x10;
          }
          iVar3 = bcmp(pIVar4->buf_,value->buf_,__n);
          if (iVar3 == 0) break;
        }
        bVar7 = (lVar6 >> 2) * -0xf0f0f0f0f0f0f0f - 1U == sVar5;
        if (bVar7) goto LAB_0015bd22;
        pIVar4 = pIVar4 + 1;
        sVar5 = sVar5 + 1;
      } while (pIVar4 != value);
    }
    if (!bVar7) {
      return sVar5;
    }
  }
LAB_0015bd22:
  if (__position._M_current ==
      (this->ipaddrs_).
      super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<flow::util::IPAddress,std::allocator<flow::util::IPAddress>>::
    _M_realloc_insert<flow::util::IPAddress_const&>
              ((vector<flow::util::IPAddress,std::allocator<flow::util::IPAddress>> *)
               &this->ipaddrs_,__position,value);
  }
  else {
    for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
      (__position._M_current)->family_ = value->family_;
      value = (IPAddress *)((long)value + (ulong)bVar8 * -8 + 4);
      __position._M_current = __position._M_current + (ulong)bVar8 * -8 + 4;
    }
    ppIVar1 = &(this->ipaddrs_).
               super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return ((long)(this->ipaddrs_).
                super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ipaddrs_).
                super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f - 1;
}

Assistant:

size_t ConstantPool::makeIPAddress(const util::IPAddress& value) {
  return ensureValue(ipaddrs_, value);
}